

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

unique_ptr<Image,_std::default_delete<Image>_> __thiscall
ImageT<unsigned_char,_2U>::resample
          (ImageT<unsigned_char,_2U> *this,uint32_t targetWidth,uint32_t targetHeight,char *filter,
          float filterScale,Boundary_Op wrapMode)

{
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  Color *pCVar4;
  void *pvVar5;
  char *pFilter;
  bool bVar6;
  char cVar7;
  uchar uVar8;
  uint uVar9;
  uint uVar10;
  ImageT<unsigned_char,_2U> *this_00;
  vector<float,_std::allocator<float>_> *pvVar11;
  Resampler *this_01;
  long lVar12;
  long *plVar13;
  long lVar14;
  runtime_error *this_02;
  uint32_t targetX;
  Contrib_List *pCVar15;
  bool bVar16;
  int iVar17;
  unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *puVar18;
  undefined4 in_register_00000034;
  undefined4 in_register_00000084;
  Boundary_Op BVar19;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  uint uVar20;
  pointer __p;
  ulong uVar21;
  unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *puVar22;
  Contrib_List *pCVar23;
  float fVar24;
  string_view fmt;
  format_args args;
  array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_2UL> resamplers
  ;
  long local_98;
  char *local_90;
  long local_88;
  TransferFunctionSRGB tfSRGB;
  array<std::vector<float,_std::allocator<float>_>,_2UL> samples;
  long local_40;
  TransferFunctionLinear tfLinear;
  
  local_90 = (char *)CONCAT44(in_register_00000084,wrapMode);
  lVar14 = CONCAT44(in_register_00000034,targetWidth);
  BVar19 = in_R9._0_4_;
  this_00 = (ImageT<unsigned_char,_2U> *)operator_new(0x28);
  uVar10 = (uint)filter;
  ImageT(this_00,targetHeight,uVar10);
  uVar3 = *(undefined8 *)(lVar14 + 0x10);
  (this_00->super_Image).transferFunction = (int)uVar3;
  (this_00->super_Image).primaries = (int)((ulong)uVar3 >> 0x20);
  if ((uVar10 != 0) && (targetHeight != 0)) {
    uVar1 = *(uint *)(lVar14 + 8);
    if ((uVar1 != 0) && (uVar2 = *(uint *)(lVar14 + 0xc), uVar2 != 0)) {
      uVar9 = uVar2;
      if (uVar2 < uVar1) {
        uVar9 = uVar1;
      }
      uVar20 = uVar10;
      if (uVar10 < targetHeight) {
        uVar20 = targetHeight;
      }
      local_88 = lVar14;
      if ((uVar20 < 0x4001) && (uVar9 < 0x4001)) {
        samples._M_elems[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        samples._M_elems[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        samples._M_elems[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        samples._M_elems[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        samples._M_elems[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        samples._M_elems[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        resamplers._M_elems[0]._M_t.
        super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>._M_t.
        super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>.
        super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl =
             (__uniq_ptr_data<basisu::Resampler,_std::default_delete<basisu::Resampler>,_true,_true>
             )(__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>)0x0;
        resamplers._M_elems[1]._M_t.
        super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>._M_t.
        super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>.
        super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl =
             (__uniq_ptr_data<basisu::Resampler,_std::default_delete<basisu::Resampler>,_true,_true>
             )(__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>)0x0;
        pvVar11 = samples._M_elems;
        puVar18 = resamplers._M_elems;
        bVar6 = true;
        do {
          bVar16 = bVar6;
          if (bVar16) {
            pCVar15 = (Contrib_List *)0x0;
            pCVar23 = (Contrib_List *)0x0;
          }
          else {
            pCVar15 = *(Contrib_List **)
                       ((long)resamplers._M_elems[0]._M_t.
                              super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                              .super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl + 0x30
                       );
            pCVar23 = *(Contrib_List **)
                       ((long)resamplers._M_elems[0]._M_t.
                              super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                              .super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl + 0x38
                       );
          }
          this_01 = (Resampler *)operator_new(0x78);
          pFilter = local_90;
          basisu::Resampler::Resampler
                    (this_01,uVar1,uVar2,targetHeight,uVar10,BVar19,0.0,1.0,local_90,pCVar15,pCVar23
                     ,filterScale,filterScale,0.0,0.0);
          tfSRGB.super_TransferFunction._vptr_TransferFunction = (TransferFunction)(_func_int **)0x0
          ;
          std::__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::reset
                    ((__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                     puVar18,this_01);
          std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::~unique_ptr
                    ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                     &tfSRGB);
          checkResamplerStatus
                    ((((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                      &puVar18->_M_t)->_M_t).
                     super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                     .super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl,pFilter);
          std::vector<float,_std::allocator<float>_>::resize(pvVar11,(ulong)uVar1);
          puVar18 = resamplers._M_elems + 1;
          pvVar11 = samples._M_elems + 1;
          bVar6 = false;
        } while (bVar16);
        tfSRGB.super_TransferFunction._vptr_TransferFunction =
             (TransferFunction)&PTR_encode_0025c910;
        tfLinear.super_TransferFunction._vptr_TransferFunction =
             (TransferFunction)&PTR_encode_0025c968;
        puVar18 = (unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)&tfSRGB;
        if (*(int *)(local_88 + 0x10) != 2) {
          puVar18 = (unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                    &tfLinear;
        }
        iVar17 = 0;
        uVar10 = 0;
        do {
          uVar21 = 0;
          do {
            lVar14 = *(long *)(local_88 + 0x18);
            pvVar11 = samples._M_elems;
            lVar12 = 0;
            bVar6 = true;
            do {
              bVar16 = bVar6;
              fVar24 = (float)(**(code **)((puVar18->_M_t).
                                           super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                                           .super__Head_base<0UL,_basisu::Resampler_*,_false>.
                                           _M_head_impl + 8))
                                        ((float)*(byte *)((ulong)(uVar10 * uVar1 + (int)uVar21) * 2
                                                          + lVar14 + lVar12) * 0.003921569,puVar18);
              (((_Vector_base<float,_std::allocator<float>_> *)
               &(pvVar11->super__Vector_base<float,_std::allocator<float>_>)._M_impl)->_M_impl).
              super__Vector_impl_data._M_start[uVar21] = fVar24;
              lVar12 = 1;
              pvVar11 = samples._M_elems + 1;
              bVar6 = false;
            } while (bVar16);
            uVar21 = uVar21 + 1;
          } while (uVar21 != uVar1);
          puVar22 = resamplers._M_elems;
          bVar6 = true;
          do {
            bVar16 = bVar6;
            cVar7 = basisu::Resampler::put_line
                              ((float *)(((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                                           *)&puVar22->_M_t)->_M_t).
                                        super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                                        .super__Head_base<0UL,_basisu::Resampler_*,_false>.
                                        _M_head_impl);
            if (cVar7 == '\0') {
              checkResamplerStatus
                        ((((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *
                           )&puVar22->_M_t)->_M_t).
                         super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                         .super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl,local_90);
            }
            puVar22 = resamplers._M_elems + 1;
            bVar6 = false;
          } while (bVar16);
          while( true ) {
            local_98 = 0;
            local_40 = 0;
            plVar13 = &local_98;
            bVar6 = true;
            do {
              bVar16 = bVar6;
              lVar14 = basisu::Resampler::get_line();
              *plVar13 = lVar14;
              plVar13 = &local_40;
              bVar6 = false;
            } while (bVar16);
            if (local_98 == 0) break;
            uVar21 = 0;
            do {
              pCVar4 = this_00->pixels;
              lVar14 = 0;
              plVar13 = &local_98;
              bVar6 = true;
              do {
                bVar16 = bVar6;
                fVar24 = (float)(**(code **)(puVar18->_M_t).
                                            super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                                            .super__Head_base<0UL,_basisu::Resampler_*,_false>.
                                            _M_head_impl)
                                          (*(undefined4 *)(*plVar13 + uVar21 * 4),puVar18);
                if (0.0 <= fVar24) {
                  uVar8 = 0xff;
                  if (fVar24 <= 1.0) {
                    uVar8 = (uchar)(int)(fVar24 * 255.0 + 0.5);
                  }
                }
                else {
                  uVar8 = '\0';
                }
                pCVar4[iVar17 * targetHeight + (int)uVar21].field_0.comps[lVar14] = uVar8;
                lVar14 = 1;
                plVar13 = &local_40;
                bVar6 = false;
              } while (bVar16);
              uVar21 = uVar21 + 1;
            } while (uVar21 != targetHeight);
            iVar17 = iVar17 + 1;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar2);
        (this->super_Image)._vptr_Image = (_func_int **)this_00;
        lVar14 = 8;
        do {
          std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::~unique_ptr
                    ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                     ((long)&resamplers._M_elems[0]._M_t.
                             super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                             .super__Head_base<0UL,_basisu::Resampler_*,_false> + lVar14));
          lVar14 = lVar14 + -8;
        } while (lVar14 != -8);
        lVar14 = 0x30;
        do {
          pvVar5 = *(void **)((long)&local_90 + lVar14);
          if (pvVar5 != (void *)0x0) {
            operator_delete(pvVar5,*(long *)((long)samples._M_elems + lVar14 + -8) - (long)pvVar5);
          }
          lVar14 = lVar14 + -0x18;
        } while (lVar14 != 0);
        return (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)
               (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)this;
      }
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      resamplers._M_elems[0]._M_t.
      super___uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>._M_t.
      super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>.
      super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl =
           (__uniq_ptr_data<basisu::Resampler,_std::default_delete<basisu::Resampler>,_true,_true>)
           (__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>)0x4000;
      fmt.size_ = 1;
      fmt.data_ = (char *)0x2a;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&resamplers;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)&samples,(v10 *)"Image larger than max supported size of {}",fmt,args);
      std::runtime_error::runtime_error(this_02,(string *)&samples);
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __assert_fail("sourceWidth && sourceHeight && targetWidth && targetHeight",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x461,
                "virtual std::unique_ptr<Image> ImageT<unsigned char, 2>::resample(uint32_t, uint32_t, const char *, float, basisu::Resampler::Boundary_Op) [componentType = unsigned char, componentCount = 2]"
               );
}

Assistant:

virtual std::unique_ptr<Image> resample(uint32_t targetWidth, uint32_t targetHeight,
            const char* filter, float filterScale, basisu::Resampler::Boundary_Op wrapMode) override {
        using namespace basisu;

        auto target = std::make_unique<ImageT<componentType, componentCount>>(targetWidth, targetHeight);
        target->setTransferFunction(transferFunction);
        target->setPrimaries(primaries);

        const auto sourceWidth = width;
        const auto sourceHeight = height;
        assert(sourceWidth && sourceHeight && targetWidth && targetHeight);

        if (std::max(sourceWidth, sourceHeight) > BASISU_RESAMPLER_MAX_DIMENSION ||
                std::max(targetWidth, targetHeight) > BASISU_RESAMPLER_MAX_DIMENSION) {
            throw std::runtime_error(fmt::format(
                    "Image larger than max supported size of {}", BASISU_RESAMPLER_MAX_DIMENSION));
        }

        std::array<std::vector<float>, componentCount> samples;
        std::array<std::unique_ptr<Resampler>, componentCount> resamplers;

        // Float types handled as SFloat HDR otherwise UNROM LDR is assumed
        const auto isHDR = std::is_floating_point_v<componentType>;

        for (uint32_t i = 0; i < componentCount; ++i) {
            resamplers[i] = std::make_unique<Resampler>(
                    sourceWidth, sourceHeight,
                    targetWidth, targetHeight,
                    wrapMode,
                    0.0f, isHDR ? 0.0f : 1.0f,
                    filter,
                    i == 0 ? nullptr : resamplers[0]->get_clist_x(),
                    i == 0 ? nullptr : resamplers[0]->get_clist_y(),
                    filterScale, filterScale,
                    0.f, 0.f);
            checkResamplerStatus(*resamplers[i], filter);
            samples[i].resize(sourceWidth);
        }

        const TransferFunctionSRGB tfSRGB;
        const TransferFunctionLinear tfLinear;
        const TransferFunction& tf = transferFunction == KHR_DF_TRANSFER_SRGB ?
                static_cast<const TransferFunction&>(tfSRGB) :
                static_cast<const TransferFunction&>(tfLinear);

        uint32_t targetY = 0;
        for (uint32_t sourceY = 0; sourceY < sourceHeight; ++sourceY) {
            // Put source lines into resampler(s)
            for (uint32_t sourceX = 0; sourceX < sourceWidth; ++sourceX) {
                const auto& sourcePixel = pixels[sourceY * sourceWidth + sourceX];
                for (uint32_t c = 0; c < componentCount; ++c) {
                    const float value = std::is_floating_point_v<componentType> ?
                            sourcePixel[c] :
                            static_cast<float>(sourcePixel[c]) * (1.f / static_cast<float>(Color::one()));

                    // c == 3: Alpha channel always uses tfLinear
                    samples[c][sourceX] = (c == 3 ? tfLinear : tf).decode(value);
                }
            }

            for (uint32_t c = 0; c < componentCount; ++c)
                if (!resamplers[c]->put_line(&samples[c][0]))
                    checkResamplerStatus(*resamplers[c], filter);

            // Retrieve any output lines
            while (true) {
                std::array<const float*, componentCount> outputLine{nullptr};
                for (uint32_t c = 0; c < componentCount; ++c)
                    outputLine[c] = resamplers[c]->get_line();

                if (outputLine[0] == nullptr)
                    break; // No new output line, break from retrieve and place in a new source line

                for (uint32_t targetX = 0; targetX < targetWidth; ++targetX) {
                    Color& targetPixel = target->pixels[targetY * targetWidth + targetX];
                    for (uint32_t c = 0; c < componentCount; ++c) {
                        const auto linearValue = outputLine[c][targetX];

                        // c == 3: Alpha channel always uses tfLinear
                        const float outValue = (c == 3 ? tfLinear : tf).encode(linearValue);
                        if constexpr (std::is_floating_point_v<componentType>) {
                            targetPixel[c] = outValue;
                        } else {
                            const auto unormValue =
                                std::isnan(outValue) ? componentType{0} :
                                outValue < 0.f ? componentType{0} :
                                outValue > 1.f ? Color::one() :
                                static_cast<componentType>(outValue * static_cast<float>(Color::one()) + 0.5f);
                            targetPixel[c] = unormValue;
                        }
                    }
                }

                ++targetY;
            }
        }

        return target;
    }